

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list.c
# Opt level: O1

int main(void)

{
  nn_list_item *pnVar1;
  nn_list *self;
  nn_list *self_00;
  nn_list *self_01;
  nn_list list;
  nn_list local_28;
  
  self = &local_28;
  self_00 = &local_28;
  self_01 = &local_28;
  that.item.prev._0_4_ = 0xffffffff;
  that.item.next = (nn_list_item *)0xffffffffffffffff;
  that.item.prev._4_4_ = 0xffffffff;
  if (that.item.prev == (nn_list_item *)0xffffffffffffffff) {
    nn_list_item_term(&that.item);
    local_28.first = (nn_list_item *)0x0;
    local_28.last = (nn_list_item *)0x0;
    nn_list_term(&local_28);
    local_28.first = (nn_list_item *)0x0;
    local_28.last = (nn_list_item *)0x0;
    nn_list_term(&local_28);
    local_28.first = (nn_list_item *)0x0;
    local_28.last = (nn_list_item *)0x0;
    that.item.prev._0_4_ = 0xffffffff;
    that.item.next = (nn_list_item *)0xffffffffffffffff;
    that.item.prev._4_4_ = 0xffffffff;
    if (that.item.prev != (nn_list_item *)0xffffffffffffffff) goto LAB_00101b73;
    nn_list_insert(&local_28,&that.item,(nn_list_item *)0x0);
    if (that.item.prev != (nn_list_item *)0x0) {
      if (that.item.prev == (nn_list_item *)0xffffffffffffffff) {
        main_cold_18();
        goto LAB_00101b69;
      }
      goto LAB_00101b78;
    }
    if (that.item.next != (nn_list_item *)0x0) goto LAB_00101b7d;
    if (local_28.first != &that.item) goto LAB_00101b82;
    if (local_28.last != &that.item) goto LAB_00101b87;
    nn_list_erase(&local_28,&that.item);
    if (that.item.prev != (nn_list_item *)0xffffffffffffffff) goto LAB_00101b8c;
    if (local_28.first != (nn_list_item *)0x0) goto LAB_00101b91;
    if (local_28.last != (nn_list_item *)0x0) goto LAB_00101b96;
    nn_list_item_term(&that.item);
    nn_list_term(&local_28);
    local_28.first = (nn_list_item *)0x0;
    local_28.last = (nn_list_item *)0x0;
    that.item.prev._0_4_ = 0xffffffff;
    that.item.next = (nn_list_item *)0xffffffffffffffff;
    that.item.prev._4_4_ = 0xffffffff;
    nn_list_insert(&local_28,&that.item,(nn_list_item *)0x0);
    if (local_28.first != &that.item) goto LAB_00101b9b;
    pnVar1 = nn_list_prev(&local_28,&that.item);
    if (pnVar1 != (nn_list_item *)0x0) goto LAB_00101ba5;
    pnVar1 = nn_list_next(self,&that.item);
    if (pnVar1 != (nn_list_item *)0x0) goto LAB_00101baa;
    nn_list_erase(&local_28,&that.item);
    nn_list_item_term(&that.item);
    nn_list_term(&local_28);
    local_28.first = (nn_list_item *)0x0;
    local_28.last = (nn_list_item *)0x0;
    that.item.prev._0_4_ = 0xffffffff;
    that.item.next = (nn_list_item *)0xffffffffffffffff;
    that.item.prev._4_4_ = 0xffffffff;
    other.item = that.item;
    nn_list_insert(&local_28,&that.item,(nn_list_item *)0x0);
    nn_list_insert(&local_28,&other.item,(nn_list_item *)0x0);
    if (local_28.first != &that.item) goto LAB_00101baf;
    pnVar1 = nn_list_next(self_00,&that.item);
    if (pnVar1 != &other.item) goto LAB_00101bb4;
    nn_list_erase(&local_28,&that.item);
    nn_list_erase(&local_28,&other.item);
    nn_list_item_term(&that.item);
    nn_list_item_term(&other.item);
    nn_list_term(&local_28);
    local_28.first = (nn_list_item *)0x0;
    local_28.last = (nn_list_item *)0x0;
    that.item.prev._0_4_ = 0xffffffff;
    that.item.next = (nn_list_item *)0xffffffffffffffff;
    that.item.prev._4_4_ = 0xffffffff;
    other.item = that.item;
    nn_list_insert(&local_28,&that.item,(nn_list_item *)0x0);
    nn_list_insert(&local_28,&other.item,local_28.first);
    if (local_28.first == &other.item) {
      pnVar1 = nn_list_next(self_01,&other.item);
      if (pnVar1 == &that.item) {
        nn_list_erase(&local_28,&that.item);
        nn_list_erase(&local_28,&other.item);
        nn_list_item_term(&that.item);
        nn_list_item_term(&other.item);
        nn_list_term(&local_28);
        return 0;
      }
      goto LAB_00101bbe;
    }
  }
  else {
LAB_00101b69:
    main_cold_1();
    main_cold_2();
LAB_00101b73:
    main_cold_3();
LAB_00101b78:
    main_cold_19();
LAB_00101b7d:
    main_cold_4();
LAB_00101b82:
    main_cold_5();
LAB_00101b87:
    main_cold_6();
LAB_00101b8c:
    main_cold_7();
LAB_00101b91:
    main_cold_8();
LAB_00101b96:
    main_cold_9();
LAB_00101b9b:
    main_cold_10();
    main_cold_17();
LAB_00101ba5:
    main_cold_11();
LAB_00101baa:
    main_cold_12();
LAB_00101baf:
    main_cold_13();
LAB_00101bb4:
    main_cold_14();
  }
  main_cold_15();
LAB_00101bbe:
  main_cold_16();
}

Assistant:

int main ()
{
    int rc;
    struct nn_list list;
    struct nn_list_item *list_item;
    struct item *item;

    /*  List item life cycle. */

    /*  Initialize the item. Make sure it's not part of any list. */
    nn_list_item_init (&that.item);
    nn_assert (!nn_list_item_isinlist (&that.item));

    /*  That may be part of some list, or uninitialized memory. */
    that.item.prev = &sentinel;
    that.item.next = &sentinel;
    nn_assert (nn_list_item_isinlist (&that.item));
    that.item.prev = NULL;
    that.item.next = NULL;
    nn_assert (nn_list_item_isinlist (&that.item));

    /*  Before termination, item must be removed from the list. */
    nn_list_item_init (&that.item);
    nn_list_item_term (&that.item);

    /*  Initializing a list. */

    /*  Uninitialized list has random content. */
    list.first = &sentinel;
    list.last = &sentinel;

    nn_list_init (&list);

    nn_assert (list.first == NULL);
    nn_assert (list.last == NULL);

    nn_list_term (&list);
    
    /*  Empty list. */
    
    nn_list_init (&list);

    rc = nn_list_empty (&list);
    nn_assert (rc == 1); 

    list_item = nn_list_begin (&list);
    nn_assert (list_item == NULL);

    list_item = nn_list_end (&list);
    nn_assert (list_item == NULL);

    nn_list_term (&list);

    /*  Inserting and erasing items. */

    nn_list_init (&list);
    nn_list_item_init (&that.item);

    /*  Item doesn'tt belong to list yet. */
    nn_assert (!nn_list_item_isinlist (&that.item));

    nn_list_insert (&list, &that.item, nn_list_end (&list));

    /*  Item is now part of a list. */
    nn_assert (nn_list_item_isinlist (&that.item));

    /*  Single item does not have prev or next item. */
    nn_assert (that.item.prev == NULL);
    nn_assert (that.item.next == NULL);

    /*  Item is both first and list item. */
    nn_assert (list.first == &that.item);
    nn_assert (list.last == &that.item);

    /*  Removing an item. */
    nn_list_erase (&list, &that.item);
    nn_assert (!nn_list_item_isinlist (&that.item));

    nn_assert (list.first == NULL);
    nn_assert (list.last == NULL);

    nn_list_item_term (&that.item);
    nn_list_term (&list);

    /*  Iterating items. */
    
    nn_list_init (&list);
    nn_list_item_init (&that.item);

    nn_list_insert (&list, &that.item, nn_list_end (&list));
    
    list_item = nn_list_begin (&list);
    nn_assert (list_item == &that.item);

    item = nn_cont (list_item, struct item, item);
    nn_assert (item == &that);

    list_item = nn_list_end (&list);
    nn_assert (list_item == NULL);

    list_item = nn_list_prev (&list, &that.item);
    nn_assert (list_item == NULL);

    list_item = nn_list_next (&list, &that.item);
    nn_assert (list_item == NULL);

    rc = nn_list_empty (&list);
    nn_assert (rc == 0);

    nn_list_erase (&list, &that.item);
    nn_list_item_term (&that.item);
    nn_list_term (&list);

    /*  Appending items. */

    nn_list_init (&list);
    nn_list_item_init (&that.item);
    nn_list_item_init (&other.item);

    nn_list_insert (&list, &that.item, nn_list_end (&list));
    nn_list_insert (&list, &other.item, nn_list_end (&list));

    list_item = nn_list_begin (&list);
    nn_assert (list_item == &that.item);

    list_item = nn_list_next (&list, list_item);
    nn_assert (list_item == &other.item);

    nn_list_erase (&list, &that.item);
    nn_list_erase (&list, &other.item);
    nn_list_item_term (&that.item);
    nn_list_item_term (&other.item);
    nn_list_term (&list);

    /*  Prepending items. */

    nn_list_init (&list);
    nn_list_item_init (&that.item);
    nn_list_item_init (&other.item);

    nn_list_insert (&list, &that.item, nn_list_begin (&list));
    nn_list_insert (&list, &other.item, nn_list_begin (&list));

    list_item = nn_list_begin (&list);
    nn_assert (list_item == &other.item);

    list_item = nn_list_next (&list, list_item);
    nn_assert (list_item == &that.item);

    nn_list_erase (&list, &that.item);
    nn_list_erase (&list, &other.item);
    nn_list_item_term (&that.item);
    nn_list_item_term (&other.item);
    nn_list_term (&list);

    return 0;
}